

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::if_statement::if_statement
          (if_statement *this,source_extend *extend,expression_ptr *cond,statement_ptr *if_s,
          statement_ptr *else_s)

{
  bool bVar1;
  statement_ptr *else_s_local;
  statement_ptr *if_s_local;
  expression_ptr *cond_local;
  source_extend *extend_local;
  if_statement *this_local;
  
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__if_statement_0029a590;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->cond_,cond);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::unique_ptr
            (&this->if_s_,if_s);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::unique_ptr
            (&this->else_s_,else_s);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->cond_);
  if (!bVar1) {
    __assert_fail("cond_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x267,
                  "mjs::if_statement::if_statement(const source_extend &, expression_ptr &&, statement_ptr &&, statement_ptr &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->if_s_);
  if (!bVar1) {
    __assert_fail("if_s_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x268,
                  "mjs::if_statement::if_statement(const source_extend &, expression_ptr &&, statement_ptr &&, statement_ptr &&)"
                 );
  }
  return;
}

Assistant:

explicit if_statement(const source_extend& extend, expression_ptr&& cond, statement_ptr&& if_s, statement_ptr&& else_s) : statement(extend), cond_(std::move(cond)), if_s_(std::move(if_s)), else_s_(std::move(else_s)) {
        assert(cond_);
        assert(if_s_);
    }